

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_mq.c
# Opt level: O3

void skynet_mq_push(message_queue *q,skynet_message *message)

{
  undefined8 *puVar1;
  uint uVar2;
  skynet_message *psVar3;
  void *pvVar4;
  int iVar5;
  skynet_message *psVar6;
  int iVar7;
  long lVar8;
  
  if (message == (skynet_message *)0x0) {
    __assert_fail("message",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_mq.c"
                  ,0xbf,"void skynet_mq_push(struct message_queue *, struct skynet_message *)");
  }
  do {
    LOCK();
    iVar7 = (q->lock).lock;
    (q->lock).lock = 1;
    UNLOCK();
  } while (iVar7 != 0);
  psVar3 = q->queue;
  iVar7 = q->tail;
  psVar3[iVar7].sz = message->sz;
  iVar5 = message->session;
  pvVar4 = message->data;
  psVar3 = psVar3 + iVar7;
  psVar3->source = message->source;
  psVar3->session = iVar5;
  psVar3->data = pvVar4;
  iVar5 = q->tail + 1;
  uVar2 = q->cap;
  iVar7 = 0;
  if (iVar5 < (int)uVar2) {
    iVar7 = iVar5;
  }
  q->tail = iVar7;
  if (q->head == iVar7) {
    psVar6 = (skynet_message *)malloc((long)(int)uVar2 * 0x30);
    psVar3 = q->queue;
    if (0 < (int)uVar2) {
      lVar8 = 0;
      do {
        *(size_t *)((long)&psVar6->sz + lVar8) = psVar3[iVar7 % (int)uVar2].sz;
        pvVar4 = psVar3[iVar7 % (int)uVar2].data;
        puVar1 = (undefined8 *)((long)&psVar6->source + lVar8);
        *puVar1 = *(undefined8 *)(psVar3 + iVar7 % (int)uVar2);
        puVar1[1] = pvVar4;
        lVar8 = lVar8 + 0x18;
        iVar7 = iVar7 + 1;
      } while ((ulong)uVar2 * 0x18 != lVar8);
    }
    q->head = 0;
    q->tail = uVar2;
    q->cap = uVar2 * 2;
    free(psVar3);
    q->queue = psVar6;
  }
  if (q->in_global == 0) {
    q->in_global = 1;
    skynet_globalmq_push(q);
  }
  (q->lock).lock = 0;
  return;
}

Assistant:

void 
skynet_mq_push(struct message_queue *q, struct skynet_message *message) {
	assert(message);
	SPIN_LOCK(q)

	q->queue[q->tail] = *message;
	if (++ q->tail >= q->cap) {
		q->tail = 0;
	}

	if (q->head == q->tail) {
		expand_queue(q);
	}

	if (q->in_global == 0) {
		q->in_global = MQ_IN_GLOBAL;
		skynet_globalmq_push(q);
	}
	
	SPIN_UNLOCK(q)
}